

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_ENDF(TT_ExecContext exc)

{
  TT_CallStack pTVar1;
  TT_CallRec *pRec;
  TT_ExecContext exc_local;
  
  if (exc->callTop < 1) {
    exc->error = 0x88;
  }
  else {
    exc->callTop = exc->callTop + -1;
    pTVar1 = exc->callStack + exc->callTop;
    pTVar1->Cur_Count = pTVar1->Cur_Count + -1;
    exc->step_ins = '\0';
    if (pTVar1->Cur_Count < 1) {
      Ins_Goto_CodeRange(exc,pTVar1->Caller_Range,pTVar1->Caller_IP);
    }
    else {
      exc->callTop = exc->callTop + 1;
      exc->IP = pTVar1->Def->start;
    }
  }
  return;
}

Assistant:

static void
  Ins_ENDF( TT_ExecContext  exc )
  {
    TT_CallRec*  pRec;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    exc->sph_in_func_flags = 0x0000;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    if ( exc->callTop <= 0 )     /* We encountered an ENDF without a call */
    {
      exc->error = FT_THROW( ENDF_In_Exec_Stream );
      return;
    }

    exc->callTop--;

    pRec = &exc->callStack[exc->callTop];

    pRec->Cur_Count--;

    exc->step_ins = FALSE;

    if ( pRec->Cur_Count > 0 )
    {
      exc->callTop++;
      exc->IP = pRec->Def->start;
    }
    else
      /* Loop through the current function */
      Ins_Goto_CodeRange( exc, pRec->Caller_Range, pRec->Caller_IP );

    /* Exit the current call frame.                      */

    /* NOTE: If the last instruction of a program is a   */
    /*       CALL or LOOPCALL, the return address is     */
    /*       always out of the code range.  This is a    */
    /*       valid address, and it is why we do not test */
    /*       the result of Ins_Goto_CodeRange() here!    */
  }